

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O2

void __thiscall ProblemTest_AddLogicalCon_Test::TestBody(ProblemTest_AddLogicalCon_Test *this)

{
  char *pcVar1;
  MutLogicalCon MVar2;
  AssertHelper local_390;
  LogicalExpr expr2;
  AssertionResult gtest_ar;
  AssertHelper local_370;
  LogicalExpr expr;
  Problem p;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&p);
  expr.super_ExprBase.impl_ = (ExprBase)((ulong)expr.super_ExprBase.impl_._4_4_ << 0x20);
  expr2.super_ExprBase.impl_._0_4_ =
       (int)((ulong)((long)p.logical_cons_.
                           super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)p.logical_cons_.
                          super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","p.num_logical_cons()",(int *)&expr,(int *)&expr2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&expr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expr2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x1a9,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&expr2,(Message *)&expr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expr2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&expr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  expr.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant(&p.super_ExprFactory,true);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon(&p,(LogicalExpr)expr.super_ExprBase.impl_);
  expr2.super_ExprBase.impl_._0_4_ = 1;
  local_390.data_._0_4_ =
       (int)((ulong)((long)p.logical_cons_.
                           super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)p.logical_cons_.
                          super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","p.num_logical_cons()",(int *)&expr2,(int *)&local_390);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&expr2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x1ad,pcVar1);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&expr2);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&expr2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  MVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::logical_con(&p,0);
  expr2.super_ExprBase.impl_ =
       (ExprBase)
       ((MVar2.
         super_BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
         .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_)->
       logical_cons_).
       super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
       ._M_impl.super__Vector_impl_data._M_start
       [MVar2.
        super_BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
        .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_].
       super_ExprBase.impl_;
  testing::internal::
  CmpHelperEQ<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((internal *)&gtest_ar,"expr","ccon.expr()",&expr,&expr2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&expr2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x1b0,pcVar1);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&expr2);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&expr2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  expr2.super_ExprBase.impl_ =
       (ExprBase)mp::BasicExprFactory<std::allocator<char>_>::MakeNot(&p.super_ExprFactory,expr);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon(&p,(LogicalExpr)expr2.super_ExprBase.impl_)
  ;
  local_390.data_._0_4_ = 2;
  local_370.data_._0_4_ =
       (undefined4)
       ((ulong)((long)p.logical_cons_.
                      super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)p.logical_cons_.
                     super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"2","p.num_logical_cons()",(int *)&local_390,(int *)&local_370);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_390);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x1b4,pcVar1);
    testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_390);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  MVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::logical_con(&p,1);
  local_390.data_ =
       (AssertHelperData *)
       ((MVar2.
         super_BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
         .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_)->
       logical_cons_).
       super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
       ._M_impl.super__Vector_impl_data._M_start
       [MVar2.
        super_BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
        .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_].
       super_ExprBase.impl_;
  testing::internal::
  CmpHelperEQ<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((internal *)&gtest_ar,"expr2","con.expr()",&expr2,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)&local_390);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_390);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x1b6,pcVar1);
    testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_390);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&p);
  return;
}

Assistant:

TEST(ProblemTest, AddLogicalCon) {
  Problem p;
  EXPECT_EQ(0, p.num_logical_cons());

  mp::LogicalExpr expr = p.MakeLogicalConstant(true);
  p.AddCon(expr);
  EXPECT_EQ(1, p.num_logical_cons());
  Problem::LogicalCon con = p.logical_con(0);
  const Problem::LogicalCon ccon = con;
  EXPECT_EQ(expr, ccon.expr());

  mp::LogicalExpr expr2 = p.MakeNot(expr);
  p.AddCon(expr2);
  EXPECT_EQ(2, p.num_logical_cons());
  con = p.logical_con(1);
  EXPECT_EQ(expr2, con.expr());
}